

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O3

int Vec_VecSortCompare3(Vec_Int_t **pp1,Vec_Int_t **pp2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  if ((0 < (*pp1)->nSize) && (0 < (*pp2)->nSize)) {
    iVar2 = *(*pp1)->pArray;
    iVar1 = *(*pp2)->pArray;
    uVar3 = 0xffffffff;
    if (iVar1 <= iVar2) {
      uVar3 = (uint)(iVar1 < iVar2);
    }
    return uVar3;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static int Vec_VecSortCompare3( Vec_Int_t ** pp1, Vec_Int_t ** pp2 )
{
    if ( Vec_IntEntry(*pp1,0) < Vec_IntEntry(*pp2,0) )
        return -1;
    if ( Vec_IntEntry(*pp1,0) > Vec_IntEntry(*pp2,0) ) 
        return 1;
    return 0; 
}